

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
detail::reader::operator()(reader *this,optional_field<example::exercise_t,_0UL> *val)

{
  byte bVar1;
  byte *pbVar2;
  size_t sVar3;
  undefined8 uVar4;
  ulong uVar5;
  
  if ((this->opts_).super_type.m_initialized != false) {
    if (((this->opts_).super_type.m_storage.dummy_.data[0] & 1U) != 0) {
      pbVar2 = (byte *)(this->buf_).data_;
      sVar3 = (this->buf_).size_;
      uVar5 = (ulong)(sVar3 != 0);
      bVar1 = *pbVar2;
      (this->buf_).data_ = pbVar2 + uVar5;
      (this->buf_).size_ = sVar3 - uVar5;
      (val->super_optional<example::exercise_t>).super_type = (type)((ushort)bVar1 * 0x100 + 1);
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar4,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> & val) const {
        if (!opts_)
            throw bad_message();
        if ((*opts_)[N]) {
            T v;
            (*this)(v);
            val = example::optional_field<T, N>(std::move(v));
        }
    }